

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotBarsEx<ImPlot::GetterBarV<int>>
               (char *label_id,GetterBarV<int> *getter,double width)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  ImPlotPlot *pIVar8;
  double dVar9;
  double dVar10;
  ImPlotContext *pIVar11;
  bool bVar12;
  ImU32 col;
  ImU32 col_00;
  ImDrawList *this;
  int iVar13;
  int iVar14;
  ImPlotRange *pIVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  ImVec2 b;
  ImVec2 a;
  byte local_44;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar12 = BeginItem(label_id,1);
  pIVar11 = GImPlot;
  if (bVar12) {
    dVar24 = width * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar13 = getter->Count, 0 < iVar13)) {
      dVar19 = getter->XShift;
      piVar7 = getter->Ys;
      iVar14 = getter->Offset;
      iVar2 = getter->Stride;
      pIVar8 = GImPlot->CurrentPlot;
      iVar3 = pIVar8->CurrentYAxis;
      uVar4 = (pIVar8->XAxis).Flags;
      pIVar15 = GImPlot->ExtentsY + iVar3;
      uVar5 = pIVar8->YAxis[iVar3].Flags;
      iVar16 = 0;
      dVar20 = 0.0;
      do {
        iVar6 = *(int *)((long)piVar7 +
                        (long)(((iVar14 + iVar16) % iVar13 + iVar13) % iVar13) * (long)iVar2);
        dVar22 = (double)iVar6;
        dVar21 = dVar19 + dVar20;
        dVar23 = dVar21 - dVar24;
        if ((uVar4 >> 10 & 1) == 0) {
          if ((long)ABS(dVar23) < 0x7ff0000000000000) {
LAB_001f105f:
            if ((0.0 < dVar23) || ((uVar4 & 0x20) == 0)) {
              dVar9 = (pIVar11->ExtentsX).Min;
              dVar10 = (pIVar11->ExtentsX).Max;
              uVar17 = -(ulong)(dVar23 < dVar9);
              uVar18 = -(ulong)(dVar10 < dVar23);
              (pIVar11->ExtentsX).Min = (double)(~uVar17 & (ulong)dVar9 | (ulong)dVar23 & uVar17);
              (pIVar11->ExtentsX).Max = (double)(~uVar18 & (ulong)dVar10 | (ulong)dVar23 & uVar18);
            }
          }
        }
        else if ((((long)ABS(dVar23) < 0x7ff0000000000000) &&
                 (pIVar8->YAxis[iVar3].Range.Min <= dVar22)) &&
                (dVar22 <= pIVar8->YAxis[iVar3].Range.Max)) goto LAB_001f105f;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((0 < iVar6) || ((uVar5 & 0x20) == 0)) {
LAB_001f10e5:
            dVar23 = pIVar11->ExtentsY[iVar3].Max;
            uVar17 = -(ulong)(dVar22 < pIVar15->Min);
            uVar18 = -(ulong)(dVar23 < dVar22);
            pIVar15->Min = (double)(~uVar17 & (ulong)pIVar15->Min | (ulong)dVar22 & uVar17);
            pIVar11->ExtentsY[iVar3].Max =
                 (double)(~uVar18 & (ulong)dVar23 | (ulong)dVar22 & uVar18);
          }
        }
        else if ((((pIVar8->XAxis).Range.Min <= dVar23) && (dVar23 <= (pIVar8->XAxis).Range.Max)) &&
                (local_44 = (byte)((uVar5 & 0x20) >> 5), (iVar6 < 1 & local_44) == 0))
        goto LAB_001f10e5;
        dVar21 = dVar21 + dVar24;
        if ((uVar4 >> 10 & 1) == 0) {
          if ((long)ABS(dVar21) < 0x7ff0000000000000) {
LAB_001f1155:
            if ((0.0 < dVar21) || ((uVar4 & 0x20) == 0)) {
              dVar22 = (pIVar11->ExtentsX).Min;
              dVar23 = (pIVar11->ExtentsX).Max;
              uVar17 = -(ulong)(dVar21 < dVar22);
              uVar18 = -(ulong)(dVar23 < dVar21);
              (pIVar11->ExtentsX).Min = (double)(~uVar17 & (ulong)dVar22 | (ulong)dVar21 & uVar17);
              (pIVar11->ExtentsX).Max = (double)(~uVar18 & (ulong)dVar23 | (ulong)dVar21 & uVar18);
            }
          }
        }
        else if ((((long)ABS(dVar21) < 0x7ff0000000000000) &&
                 (pIVar8->YAxis[iVar3].Range.Min <= 0.0)) && (0.0 <= pIVar8->YAxis[iVar3].Range.Max)
                ) goto LAB_001f1155;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((uVar5 & 0x20) == 0) {
LAB_001f11c7:
            dVar21 = pIVar11->ExtentsY[iVar3].Max;
            pIVar15->Min = (double)(-(ulong)(pIVar15->Min <= 0.0) & (ulong)pIVar15->Min);
            pIVar11->ExtentsY[iVar3].Max = (double)(-(ulong)(0.0 <= dVar21) & (ulong)dVar21);
          }
        }
        else if ((((uVar5 & 0x20) == 0) && ((pIVar8->XAxis).Range.Min <= dVar21)) &&
                (dVar21 <= (pIVar8->XAxis).Range.Max)) goto LAB_001f11c7;
        dVar20 = dVar20 + 1.0;
        iVar16 = iVar16 + 1;
      } while (iVar13 != iVar16);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar11->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar11->NextItemData).Colors + 1);
    iVar13 = getter->Count;
    if (0 < iVar13) {
      bVar12 = (pIVar11->NextItemData).RenderFill;
      bVar1 = (pIVar11->NextItemData).RenderLine;
      iVar14 = 0;
      do {
        iVar2 = *(int *)((long)getter->Ys +
                        (long)(((getter->Offset + iVar14) % iVar13 + iVar13) % iVar13) *
                        (long)getter->Stride);
        if (iVar2 != 0) {
          dVar19 = (double)iVar14 + getter->XShift;
          local_38 = PlotToPixels(dVar19 - dVar24,(double)iVar2,-1);
          local_40 = PlotToPixels(dVar19 + dVar24,0.0,-1);
          if ((pIVar11->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_38,&local_40,col_00,0.0,0);
          }
          if (((bVar12 ^ 1U | col != col_00) & bVar1) != 0) {
            ImDrawList::AddRect(this,&local_38,&local_40,col,0.0,0xf0,
                                (pIVar11->NextItemData).LineWeight);
          }
          iVar13 = getter->Count;
        }
        iVar14 = iVar14 + 1;
      } while (iVar14 < iVar13);
    }
    pIVar11 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar11->NextItemData);
    pIVar11->PreviousItem = pIVar11->CurrentItem;
    pIVar11->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsEx(const char* label_id, const Getter& getter, double width) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const double half_width = width / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(p.x - half_width, p.y));
                FitPoint(ImPlotPoint(p.x + half_width, 0));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.y == 0)
                continue;
            ImVec2 a = PlotToPixels(p.x - half_width, p.y);
            ImVec2 b = PlotToPixels(p.x + half_width, 0);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}